

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O3

void __thiscall
duckdb::PerfectHashJoinExecutor::FillSelectionVectorSwitchProbe
          (PerfectHashJoinExecutor *this,Vector *source,SelectionVector *build_sel_vec,
          SelectionVector *probe_sel_vec,idx_t count,idx_t *probe_sel_count)

{
  PhysicalType PVar1;
  NotImplementedException *this_00;
  string local_40;
  
  PVar1 = (source->type).physical_type_;
  switch(PVar1) {
  case UINT8:
    TemplatedFillSelectionVectorProbe<unsigned_char>
              (this,source,build_sel_vec,probe_sel_vec,count,probe_sel_count);
    return;
  case INT8:
    TemplatedFillSelectionVectorProbe<signed_char>
              (this,source,build_sel_vec,probe_sel_vec,count,probe_sel_count);
    return;
  case UINT16:
    TemplatedFillSelectionVectorProbe<unsigned_short>
              (this,source,build_sel_vec,probe_sel_vec,count,probe_sel_count);
    return;
  case INT16:
    TemplatedFillSelectionVectorProbe<short>
              (this,source,build_sel_vec,probe_sel_vec,count,probe_sel_count);
    return;
  case UINT32:
    TemplatedFillSelectionVectorProbe<unsigned_int>
              (this,source,build_sel_vec,probe_sel_vec,count,probe_sel_count);
    return;
  case INT32:
    TemplatedFillSelectionVectorProbe<int>
              (this,source,build_sel_vec,probe_sel_vec,count,probe_sel_count);
    return;
  case UINT64:
    TemplatedFillSelectionVectorProbe<unsigned_long>
              (this,source,build_sel_vec,probe_sel_vec,count,probe_sel_count);
    return;
  case INT64:
    TemplatedFillSelectionVectorProbe<long>
              (this,source,build_sel_vec,probe_sel_vec,count,probe_sel_count);
    return;
  }
  if (PVar1 == UINT128) {
    TemplatedFillSelectionVectorProbe<duckdb::uhugeint_t>
              (this,source,build_sel_vec,probe_sel_vec,count,probe_sel_count);
    return;
  }
  if (PVar1 != INT128) {
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Type not supported","");
    NotImplementedException::NotImplementedException(this_00,&local_40);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  TemplatedFillSelectionVectorProbe<duckdb::hugeint_t>
            (this,source,build_sel_vec,probe_sel_vec,count,probe_sel_count);
  return;
}

Assistant:

PerfectHashJoinState(ClientContext &context, const PhysicalHashJoin &join) : probe_executor(context) {
		join_keys.Initialize(Allocator::Get(context), join.condition_types);
		for (auto &cond : join.conditions) {
			probe_executor.AddExpression(*cond.left);
		}
		build_sel_vec.Initialize(STANDARD_VECTOR_SIZE);
		probe_sel_vec.Initialize(STANDARD_VECTOR_SIZE);
		seq_sel_vec.Initialize(STANDARD_VECTOR_SIZE);
	}